

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_list(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lyd_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  lysp_node *plVar3;
  char *pcVar4;
  lysp_node **pplVar5;
  char *format;
  ly_stmt lVar6;
  lysp_restr **extraout_RDX;
  lysp_restr **restrs;
  lysp_node *plVar7;
  lysp_restr **extraout_RDX_00;
  ly_ctx *plVar8;
  lysp_ext_instance **exts;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **exts_00;
  ly_stmt local_c4;
  char **local_c0;
  char *local_b8;
  size_t local_b0;
  uint16_t *local_a8;
  lysp_qname **local_a0;
  lysp_ext_instance **local_98;
  lysp_node *local_90;
  lysp_node **local_88;
  lysp_node **local_80;
  uint16_t *local_78;
  lysp_node **local_70;
  uint32_t *local_68;
  uint16_t *local_60;
  lysp_node *local_58;
  char **local_50;
  lysp_node *local_48;
  char **local_40;
  lysp_ext_instance *local_38;
  
  parent_00 = (lysp_node *)calloc(1,0x90);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = LY_EMEM;
    ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_list");
  }
  else {
    plVar7 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar3 = plVar7;
        plVar7 = plVar3->next;
      } while (plVar7 != (lysp_node *)0x0);
      siblings = &plVar3->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = 0x10;
    parent_00->parent = parent;
    exts = &local_38;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_b8,(char **)exts,&local_b0);
    if (LVar2 == LY_SUCCESS) {
      if (local_38 == (lysp_ext_instance *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = local_b8;
        if (local_b0 == 0) {
          pcVar4 = "";
        }
        LVar2 = lydict_insert(plVar8,pcVar4,local_b0,&parent_00->name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar2 = lydict_insert_zc(plVar8,local_b8,&parent_00->name);
      }
      if (((LVar2 == LY_SUCCESS) &&
          (LVar2 = get_keyword(ctx,&local_c4,&local_b8,&local_b0), LVar2 == LY_SUCCESS)) &&
         (LVar2 = LY_SUCCESS, local_c4 != LY_STMT_SYNTAX_SEMICOLON)) {
        if (local_c4 == LY_STMT_SYNTAX_LEFT_BRACE) {
          LVar2 = get_keyword(ctx,&local_c4,&local_b8,&local_b0);
          if ((LVar2 == LY_SUCCESS) && (LVar2 = LY_SUCCESS, local_c4 != LY_STMT_SYNTAX_RIGHT_BRACE))
          {
            exts_00 = &parent_00->exts;
            local_98 = &parent_00[1].exts;
            local_40 = &parent_00[1].dsc;
            local_a0 = &parent_00[1].iffeatures;
            local_48 = parent_00 + 1;
            local_50 = &parent_00[1].name;
            local_c0 = &parent_00[1].ref;
            local_58 = parent_00 + 2;
            local_60 = &parent_00[2].nodetype;
            local_a8 = &parent_00->flags;
            local_68 = (uint32_t *)&parent_00[2].field_0xc;
            local_70 = &parent_00[1].next;
            local_78 = &parent_00[1].nodetype;
            local_80 = (lysp_node **)&parent_00->ref;
            local_88 = (lysp_node **)&parent_00->dsc;
            local_90 = (lysp_node *)&parent_00->iffeatures;
            restrs = extraout_RDX;
            do {
              if ((int)local_c4 < 0x80000) {
                if ((int)local_c4 < 0x800) {
                  if ((int)local_c4 < 0x40) {
                    if (local_c4 == LY_STMT_NOTIFICATION) {
                      plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (1 < *(byte *)&plVar1[2].schema) {
                        LVar2 = parse_notif(ctx,parent_00,(lysp_node_notif **)local_98);
                        goto LAB_0017781c;
                      }
                      plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
                      pcVar4 = "notification";
                    }
                    else if (local_c4 == LY_STMT_ACTION) {
                      plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (1 < *(byte *)&plVar1[2].schema) {
                        LVar2 = parse_action(ctx,parent_00,(lysp_node_action **)local_a0);
                        goto LAB_0017781c;
                      }
                      plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
                      pcVar4 = "action";
                    }
                    else {
                      if (local_c4 != LY_STMT_ANYDATA) goto LAB_001778c9;
                      plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (1 < *(byte *)&plVar1[2].schema) goto LAB_00177662;
                      plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
                      pcVar4 = "anydata";
                    }
                    format = 
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ;
LAB_0017795b:
                    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar4,"list");
                    goto LAB_001778be;
                  }
                  if (local_c4 == LY_STMT_ANYXML) {
LAB_00177662:
                    LVar2 = parse_any(ctx,local_c4,parent_00,(lysp_node **)local_c0);
                  }
                  else if (local_c4 == LY_STMT_CHOICE) {
                    LVar2 = parse_choice(ctx,parent_00,(lysp_node **)local_c0);
                  }
                  else {
                    if (local_c4 != LY_STMT_CONTAINER) goto LAB_001778c9;
                    LVar2 = parse_container(ctx,parent_00,(lysp_node **)local_c0);
                  }
                }
                else if ((int)local_c4 < 0x4000) {
                  if (local_c4 == LY_STMT_GROUPING) {
                    LVar2 = parse_grouping(ctx,parent_00,(lysp_node_grp **)local_40);
                  }
                  else if (local_c4 == LY_STMT_LEAF) {
                    LVar2 = parse_leaf(ctx,parent_00,(lysp_node **)local_c0);
                  }
                  else {
                    if (local_c4 != LY_STMT_LEAF_LIST) goto LAB_001778c9;
                    LVar2 = parse_leaflist(ctx,parent_00,(lysp_node **)local_c0);
                  }
                }
                else if (local_c4 == LY_STMT_LIST) {
                  LVar2 = parse_list(ctx,parent_00,(lysp_node **)local_c0);
                }
                else if (local_c4 == LY_STMT_USES) {
                  LVar2 = parse_uses(ctx,parent_00,(lysp_node **)local_c0);
                }
                else {
                  if (local_c4 != LY_STMT_CONFIG) goto LAB_001778c9;
                  LVar2 = parse_config(ctx,local_a8,exts_00);
                }
              }
              else if ((int)local_c4 < 0x1d0000) {
                if ((int)local_c4 < 0x160000) {
                  if (local_c4 == LY_STMT_DESCRIPTION) {
                    lVar6 = LY_STMT_DESCRIPTION;
                    pplVar5 = local_88;
                    plVar7 = *local_88;
LAB_001777bf:
                    exts = (lysp_ext_instance **)0x2;
                    LVar2 = parse_text_field(ctx,plVar7,lVar6,(uint32_t)pplVar5,(char **)0x2,
                                             Y_IDENTIF_ARG,(uint16_t *)exts_00,exts_00);
                  }
                  else {
                    if (local_c4 != LY_STMT_EXTENSION_INSTANCE) {
                      if (local_c4 == LY_STMT_IF_FEATURE) {
                        lVar6 = LY_STMT_IF_FEATURE;
                        plVar7 = local_90;
                        goto LAB_00177812;
                      }
                      goto LAB_001778c9;
                    }
                    exts = (lysp_ext_instance **)0x4000;
                    LVar2 = parse_ext(ctx,local_b8,local_b0,parent_00,LY_STMT_LIST,0,exts_00);
                  }
                }
                else {
                  if (local_c4 == LY_STMT_KEY) {
                    lVar6 = LY_STMT_KEY;
                    pplVar5 = local_70;
                    plVar7 = parent_00;
                    goto LAB_001777bf;
                  }
                  if (local_c4 == LY_STMT_MAX_ELEMENTS) {
                    LVar2 = parse_maxelements(ctx,local_68,local_a8,exts_00);
                  }
                  else {
                    if (local_c4 != LY_STMT_MIN_ELEMENTS) goto LAB_001778c9;
                    LVar2 = parse_minelements(ctx,(uint32_t *)local_60,local_a8,exts_00);
                  }
                }
              }
              else if ((int)local_c4 < 0x2c0000) {
                if (local_c4 == LY_STMT_MUST) {
                  LVar2 = parse_restrs(ctx,(ly_stmt)local_48,restrs);
                }
                else {
                  if (local_c4 != LY_STMT_ORDERED_BY) {
                    if (local_c4 == LY_STMT_REFERENCE) {
                      lVar6 = LY_STMT_REFERENCE;
                      pplVar5 = local_80;
                      plVar7 = *local_80;
                      goto LAB_001777bf;
                    }
                    goto LAB_001778c9;
                  }
                  LVar2 = parse_orderedby(ctx,parent_00);
                }
              }
              else if ((int)local_c4 < 0x300000) {
                if (local_c4 == LY_STMT_STATUS) {
                  LVar2 = parse_status(ctx,local_a8,exts_00);
                }
                else {
                  if (local_c4 != LY_STMT_TYPEDEF) {
LAB_001778c9:
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar8 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar8 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar4 = lyplg_ext_stmt2str(local_c4);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
                    goto LAB_0017795b;
                  }
                  LVar2 = parse_typedef(ctx,parent_00,(lysp_tpdf **)local_50);
                }
              }
              else if (local_c4 == LY_STMT_UNIQUE) {
                lVar6 = LY_STMT_UNIQUE;
                plVar7 = local_58;
LAB_00177812:
                LVar2 = parse_qnames(ctx,lVar6,(lysp_qname **)plVar7,(yang_arg)exts_00,exts);
              }
              else {
                if (local_c4 != LY_STMT_WHEN) goto LAB_001778c9;
                LVar2 = parse_when(ctx,(lysp_when **)local_78);
              }
LAB_0017781c:
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
              LVar2 = get_keyword(ctx,&local_c4,&local_b8,&local_b0);
              if (LVar2 != LY_SUCCESS) {
                return LVar2;
              }
              restrs = extraout_RDX_00;
            } while (local_c4 != LY_STMT_SYNTAX_RIGHT_BRACE);
            if ((*exts_00 == (lysp_ext_instance *)0x0) ||
               (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts_00,'\x01',(uint32_t *)0x0),
               LVar2 == LY_SUCCESS)) {
              LVar2 = LY_SUCCESS;
            }
          }
        }
        else {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(local_c4);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
LAB_001778be:
          LVar2 = LY_EVALID;
        }
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_list(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_list *list;

    /* create new list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, list, next, LY_EMEM);
    list->nodetype = LYS_LIST;
    list->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, list->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &list->flags, &list->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, list->dsc, LY_STMT_DESCRIPTION, 0, &list->dsc, Y_STR_ARG, NULL, &list->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &list->iffeatures, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, list->ref, LY_STMT_REFERENCE, 0, &list->ref, Y_STR_ARG, NULL, &list->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &list->flags, &list->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &list->when));
            break;
        case LY_STMT_KEY:
            LY_CHECK_RET(parse_text_field(ctx, list, LY_STMT_KEY, 0, &list->key, Y_STR_ARG, NULL, &list->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &list->max, &list->flags, &list->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &list->min, &list->flags, &list->exts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(parse_orderedby(ctx, &list->node));
            break;
        case LY_STMT_UNIQUE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_UNIQUE, &list->uniques, Y_STR_ARG, &list->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "list");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)list, &list->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)list, &list->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)list, &list->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &list->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "list");
            LY_CHECK_RET(parse_action(ctx, (struct lysp_node *)list, &list->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)list, &list->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "list");
            LY_CHECK_RET(parse_notif(ctx, (struct lysp_node *)list, &list->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, list, LY_STMT_LIST, 0, &list->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "list");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, list->exts, ret, cleanup);
    }

cleanup:
    return ret;
}